

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall
chrono::ChOptimizerGenetic::ApplyCrossover
          (ChOptimizerGenetic *this,ChGenotype *par1,ChGenotype *par2,ChGenotype *child1,
          ChGenotype *child2)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scalar *pSVar6;
  ChGenotype *pCVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int nvars;
  ChMatrixDynamic<> mtemp;
  int local_74;
  double local_70;
  double local_68;
  undefined4 local_5c;
  double local_58;
  int local_4c;
  void *local_48 [3];
  
  local_74 = (int)(par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
  local_4c = 1;
  pCVar7 = child1;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_48,&local_74,&local_4c);
  local_5c = (undefined4)CONCAT71((int7)((ulong)pCVar7 >> 8),1);
  switch(this->crossover) {
  case ARITMETIC:
    lVar8 = 0;
    while (lVar8 < local_74) {
      dVar9 = ChRandom();
      local_70 = ChRandom();
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par1,lVar8);
      SVar1 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par2,lVar8);
      dVar10 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child1,lVar8
                         );
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar9;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = SVar1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (1.0 - dVar9) * dVar10;
      auVar5 = vfmadd231sd_fma(auVar12,auVar20,auVar2);
      *pSVar6 = auVar5._0_8_;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child2,lVar8
                         );
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_70;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = SVar1;
      lVar8 = lVar8 + 1;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (1.0 - local_70) * dVar10;
      auVar5 = vfmadd213sd_fma(auVar30,auVar21,auVar13);
      *pSVar6 = auVar5._0_8_;
    }
    break;
  case BLEND:
    for (lVar8 = 0; lVar8 < local_74; lVar8 = lVar8 + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par1,lVar8);
      SVar1 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par2,lVar8);
      dVar10 = *pSVar6;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = SVar1;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar10 * 0.30000000000000004;
      auVar5 = vfmadd231sd_fma(auVar28,auVar33,ZEXT816(0x3fe6666666666666));
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child1,lVar8
                         );
      auVar29._8_8_ = 0;
      auVar29._0_8_ = SVar1;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar10 * 0.7;
      auVar16 = vfmadd231sd_fma(auVar19,auVar29,ZEXT816(0x3fd3333333333333));
      *pSVar6 = auVar16._0_8_;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child2,lVar8
                         );
      *pSVar6 = auVar5._0_8_;
    }
    break;
  case BLEND_RANDOM:
    dVar10 = ChRandom();
    local_68 = ChRandom();
    lVar8 = 0;
    local_58 = 1.0 - local_68;
    local_70 = 1.0 - dVar10;
    while (lVar8 < local_74) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par1,lVar8);
      SVar1 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par2,lVar8);
      dVar9 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child1,lVar8
                         );
      auVar22._8_8_ = 0;
      auVar22._0_8_ = SVar1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar10;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar9 * local_70;
      auVar5 = vfmadd231sd_fma(auVar14,auVar22,auVar3);
      *pSVar6 = auVar5._0_8_;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child2,lVar8
                         );
      auVar23._8_8_ = 0;
      auVar23._0_8_ = SVar1;
      lVar8 = lVar8 + 1;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_68;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar9 * local_58;
      auVar5 = vfmadd132sd_fma(auVar23,auVar15,auVar4);
      *pSVar6 = auVar5._0_8_;
    }
    break;
  case HEURISTIC:
    pCVar7 = par2;
    if (par1->fitness < par2->fitness) {
      pCVar7 = par1;
      par1 = par2;
    }
    lVar8 = 0;
    while (lVar8 < local_74) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)par1,lVar8);
      dVar10 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar7,lVar8
                         );
      dVar9 = *pSVar6;
      dVar11 = ChRandom();
      local_70 = (this->super_ChOptimizer).xv_sup[lVar8];
      local_68 = (this->super_ChOptimizer).xv_inf[lVar8];
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child1,lVar8
                         );
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar10;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar11;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar10 - dVar9;
      auVar5 = vfmadd213sd_fma(auVar31,auVar24,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_70;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_68;
      auVar5 = vminsd_avx(auVar17,auVar5);
      auVar5 = vmaxsd_avx(auVar25,auVar5);
      *pSVar6 = auVar5._0_8_;
      dVar11 = ChRandom();
      local_70 = (this->super_ChOptimizer).xv_sup[lVar8];
      local_68 = (this->super_ChOptimizer).xv_inf[lVar8];
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)child2,lVar8
                         );
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar10 - dVar9;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar11;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_68;
      lVar8 = lVar8 + 1;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar10;
      auVar5 = vfmadd213sd_fma(auVar18,auVar26,auVar5);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_70;
      auVar5 = vminsd_avx(auVar27,auVar5);
      auVar5 = vmaxsd_avx(auVar32,auVar5);
      *pSVar6 = auVar5._0_8_;
    }
    break;
  case DISABLED:
    ChGenotype::Copy(child1,par1);
    ChGenotype::Copy(child2,par2);
    local_5c = 0;
  }
  child1->need_eval = SUB41(local_5c,0);
  child2->need_eval = SUB41(local_5c,0);
  Eigen::internal::handmade_aligned_free(local_48[0]);
  return;
}

Assistant:

void ChOptimizerGenetic::ApplyCrossover(ChGenotype* par1, ChGenotype* par2, ChGenotype& child1, ChGenotype& child2) {
    int nvars = (int)par1->genes.size();
    int mv;
    double fen1, fen2, newfen1, newfen2, w1, w2;
    ChMatrixDynamic<> mtemp(nvars, 1);

    switch (crossover) {
        case CrossoverType::DISABLED:
            // do not perform crossover, return same as parent without need of evaluation
            child1.Copy(par1);
            child2.Copy(par2);
            child1.need_eval = false;
            child2.need_eval = false;
            return;  // %%%%

        case CrossoverType::ARITMETIC:
            // 'Arithmetic' crossover:
            // average of fenotypes with random wheight
            for (mv = 0; mv < nvars; mv++) {
                w1 = ChRandom();
                w2 = ChRandom();
                fen1 = par1->genes(mv);
                fen2 = par2->genes(mv);
                newfen1 = fen1 * w1 + fen2 * (1 - w1);
                newfen2 = fen1 * w2 + fen2 * (1 - w2);
                child1.genes(mv) = newfen1;
                child2.genes(mv) = newfen2;
            }
            break;

        case CrossoverType::BLEND:
            // 'Blend' crossover:
            // linear average of two fenotypes with constant weights 0.3 and 0.7 (children are linear
            // interpolation of parents 0...0.3...0.7...1)
            w1 = 0.3;
            w2 = 0.7;
            for (mv = 0; mv < nvars; mv++) {
                fen1 = par1->genes(mv);
                fen2 = par2->genes(mv);
                newfen1 = fen1 * w1 + fen2 * (1 - w1);
                newfen2 = fen1 * w2 + fen2 * (1 - w2);
                child1.genes(mv) = newfen1;
                child2.genes(mv) = newfen2;
            }
            break;
        case CrossoverType::BLEND_RANDOM:
            // 'Blend random' crossover:
            // linear average of two fenotypes with random weights 0.3 and 0.7 (children are linear
            // interpolation of parents 0...rnd...rnd...1)
            w1 = ChRandom();
            w2 = ChRandom();
            for (mv = 0; mv < nvars; mv++) {
                fen1 = par1->genes(mv);
                fen2 = par2->genes(mv);
                newfen1 = fen1 * w1 + fen2 * (1 - w1);
                newfen2 = fen1 * w2 + fen2 * (1 - w2);
                child1.genes(mv) = newfen1;
                child2.genes(mv) = newfen2;
            }
            break;
        case CrossoverType::HEURISTIC:
            // 'heuristic crossover' extrapolates the child in the direction of
            // the parent with best fitness
            ChGenotype* lead_par;
            ChGenotype* slave_par;
            if (par1->fitness >= par2->fitness) {
                lead_par = par1;
                slave_par = par2;
            } else {
                lead_par = par2;
                slave_par = par1;
            }

            for (mv = 0; mv < nvars; mv++) {
                fen1 = lead_par->genes(mv);
                fen2 = slave_par->genes(mv);

                w1 = ChRandom();
                newfen1 = fen1 + w1 * (fen1 - fen2);
                if (newfen1 > xv_sup[mv])
                    newfen1 = xv_sup[mv];
                if (newfen1 < xv_inf[mv])
                    newfen1 = xv_inf[mv];
                child1.genes(mv) = newfen1;

                w2 = ChRandom();
                newfen2 = fen1 + w2 * (fen1 - fen2);
                if (newfen2 > xv_sup[mv])
                    newfen2 = xv_sup[mv];
                if (newfen2 < xv_inf[mv])
                    newfen2 = xv_inf[mv];
                child2.genes(mv) = newfen2;
            }
            break;

        default:
            break;
    }

    // set flags: the chromosomes has been changed,
    // and fitness should be computed!
    child1.need_eval = true;
    child2.need_eval = true;
}